

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSkinMeshBuffer.h
# Opt level: O0

void __thiscall irr::scene::SSkinMeshBuffer::convertToTangents(SSkinMeshBuffer *this)

{
  undefined4 uVar1;
  u32 uVar2;
  S3DVertex2TCoords *pSVar3;
  S3DVertexTangents *in_RDI;
  S3DVertexTangents Vertex_1;
  u32 n_1;
  S3DVertexTangents Vertex;
  u32 n;
  undefined4 in_stack_ffffffffffffff68;
  uint uVar4;
  u32 in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint local_4c;
  uint local_c;
  
  if (in_RDI[6].super_S3DVertex.TCoords.Y == 0.0) {
    local_c = 0;
    while (uVar4 = local_c,
          uVar2 = core::array<irr::video::S3DVertex>::size((array<irr::video::S3DVertex> *)0x2a996d)
          , uVar4 < uVar2) {
      video::S3DVertexTangents::S3DVertexTangents(in_RDI);
      core::array<irr::video::S3DVertex>::operator[]((array<irr::video::S3DVertex> *)in_RDI,uVar4);
      core::array<irr::video::S3DVertex>::operator[]((array<irr::video::S3DVertex> *)in_RDI,uVar4);
      core::array<irr::video::S3DVertex>::operator[]((array<irr::video::S3DVertex> *)in_RDI,uVar4);
      core::array<irr::video::S3DVertex>::operator[]((array<irr::video::S3DVertex> *)in_RDI,uVar4);
      core::array<irr::video::S3DVertexTangents>::push_back
                ((array<irr::video::S3DVertexTangents> *)in_RDI,
                 (S3DVertexTangents *)CONCAT44(uVar4,in_stack_ffffffffffffff68));
      local_c = local_c + 1;
    }
    core::array<irr::video::S3DVertex>::clear
              ((array<irr::video::S3DVertex> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    in_RDI[6].super_S3DVertex.TCoords.Y = 2.8026e-45;
  }
  else if (in_RDI[6].super_S3DVertex.TCoords.Y == 1.4013e-45) {
    local_4c = 0;
    while (uVar4 = local_4c,
          uVar2 = core::array<irr::video::S3DVertex2TCoords>::size
                            ((array<irr::video::S3DVertex2TCoords> *)0x2a9a82), uVar4 < uVar2) {
      video::S3DVertexTangents::S3DVertexTangents(in_RDI);
      core::array<irr::video::S3DVertex2TCoords>::operator[]
                ((array<irr::video::S3DVertex2TCoords> *)in_RDI,in_stack_ffffffffffffff6c);
      pSVar3 = core::array<irr::video::S3DVertex2TCoords>::operator[]
                         ((array<irr::video::S3DVertex2TCoords> *)in_RDI,in_stack_ffffffffffffff6c);
      in_stack_ffffffffffffff80 = (pSVar3->super_S3DVertex).Pos.Z;
      pSVar3 = core::array<irr::video::S3DVertex2TCoords>::operator[]
                         ((array<irr::video::S3DVertex2TCoords> *)in_RDI,in_stack_ffffffffffffff6c);
      uVar1 = (pSVar3->super_S3DVertex).Normal.X;
      core::array<irr::video::S3DVertex2TCoords>::operator[]
                ((array<irr::video::S3DVertex2TCoords> *)in_RDI,in_stack_ffffffffffffff6c);
      core::array<irr::video::S3DVertexTangents>::push_back
                ((array<irr::video::S3DVertexTangents> *)in_RDI,
                 (S3DVertexTangents *)CONCAT44(in_stack_ffffffffffffff6c,uVar4));
      local_4c = local_4c + 1;
      in_stack_ffffffffffffff84 = uVar1;
    }
    core::array<irr::video::S3DVertex2TCoords>::clear
              ((array<irr::video::S3DVertex2TCoords> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    in_RDI[6].super_S3DVertex.TCoords.Y = 2.8026e-45;
  }
  return;
}

Assistant:

void convertToTangents()
	{
		if (VertexType == video::EVT_STANDARD) {
			for (u32 n = 0; n < Vertices_Standard.size(); ++n) {
				video::S3DVertexTangents Vertex;
				Vertex.Color = Vertices_Standard[n].Color;
				Vertex.Pos = Vertices_Standard[n].Pos;
				Vertex.Normal = Vertices_Standard[n].Normal;
				Vertex.TCoords = Vertices_Standard[n].TCoords;
				Vertices_Tangents.push_back(Vertex);
			}
			Vertices_Standard.clear();
			VertexType = video::EVT_TANGENTS;
		} else if (VertexType == video::EVT_2TCOORDS) {
			for (u32 n = 0; n < Vertices_2TCoords.size(); ++n) {
				video::S3DVertexTangents Vertex;
				Vertex.Color = Vertices_2TCoords[n].Color;
				Vertex.Pos = Vertices_2TCoords[n].Pos;
				Vertex.Normal = Vertices_2TCoords[n].Normal;
				Vertex.TCoords = Vertices_2TCoords[n].TCoords;
				Vertices_Tangents.push_back(Vertex);
			}
			Vertices_2TCoords.clear();
			VertexType = video::EVT_TANGENTS;
		}
	}